

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Min_f64(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  Value *pVVar2;
  Value VVar3;
  
  this_00 = &this->super_w3Stack;
  pVVar2 = w3Stack::value(this_00,Tag_f64);
  VVar3 = (Value)pVVar2->f64;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  pVVar2 = w3Stack::value(this_00,Tag_f64);
  if (pVVar2->f64 <= VVar3.f64) {
    VVar3.f64 = pVVar2->f64;
  }
  *pVVar2 = VVar3;
  return;
}

Assistant:

INTERP (Min_f64)
{
    const double z2 = pop_f64 ();
    double& z1 = f64 ();
    z1 = std::min (z1, z2);
}